

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-priority.c
# Opt level: O0

int run_test_process_priority(void)

{
  int iVar1;
  undefined4 uVar2;
  int local_14;
  int local_10;
  int i;
  int r;
  int priority;
  
  local_10 = uv_os_getpriority(0,0);
  if (local_10 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-priority.c"
            ,0x26,"r == UV_EINVAL");
    abort();
  }
  local_14 = -0x14;
  local_10 = -0x16;
  do {
    if (0x13 < local_14) {
      iVar1 = uv_os_setpriority(0,0xffffffeb);
      if (iVar1 != -0x16) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-priority.c"
                ,0x4f,"uv_os_setpriority(0, UV_PRIORITY_HIGHEST - 1) == UV_EINVAL");
        abort();
      }
      iVar1 = uv_os_setpriority(0,0x14);
      if (iVar1 == -0x16) {
        return 0;
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-priority.c"
              ,0x50,"uv_os_setpriority(0, UV_PRIORITY_LOW + 1) == UV_EINVAL");
      abort();
    }
    local_10 = uv_os_setpriority(0,local_14);
    if (local_10 != -0xd) {
      if (local_10 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-priority.c"
                ,0x31,"r == 0");
        abort();
      }
      iVar1 = uv_os_getpriority(0,&i);
      if (iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-priority.c"
                ,0x32,"uv_os_getpriority(0, &priority) == 0");
        abort();
      }
      if (i != local_14) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-priority.c"
                ,0x37,"priority == i");
        abort();
      }
      uVar2 = uv_os_getpid();
      iVar1 = uv_os_getpriority(uVar2,&local_10);
      if (iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-priority.c"
                ,0x4a,"uv_os_getpriority(uv_os_getpid(), &r) == 0");
        abort();
      }
      if (i != local_10) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-priority.c"
                ,0x4b,"priority == r");
        abort();
      }
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

TEST_IMPL(process_priority) {
  int priority;
  int r;
  int i;

#if defined(__MVS__)
  if (uv_os_setpriority(0, 0) == UV_ENOSYS)
    RETURN_SKIP("functionality not supported on zOS");
#endif

  /* Verify that passing a NULL pointer returns UV_EINVAL. */
  r = uv_os_getpriority(0, NULL);
  ASSERT(r == UV_EINVAL);

  /* Verify that all valid values work. */
  for (i = UV_PRIORITY_HIGHEST; i <= UV_PRIORITY_LOW; i++) {
    r = uv_os_setpriority(0, i);

    /* If UV_EACCES is returned, the current user doesn't have permission to
       set this specific priority. */
    if (r == UV_EACCES)
      continue;

    ASSERT(r == 0);
    ASSERT(uv_os_getpriority(0, &priority) == 0);

    /* Verify that the priority values match on Unix, and are range mapped
       on Windows. */
#ifndef _WIN32
    ASSERT(priority == i);
#else
    /* On Windows, only elevated users can set UV_PRIORITY_HIGHEST. Other
       users will silently be set to UV_PRIORITY_HIGH. */
    if (i < UV_PRIORITY_HIGH)
      ASSERT(priority == UV_PRIORITY_HIGHEST || priority == UV_PRIORITY_HIGH);
    else if (i < UV_PRIORITY_ABOVE_NORMAL)
      ASSERT(priority == UV_PRIORITY_HIGH);
    else if (i < UV_PRIORITY_NORMAL)
      ASSERT(priority == UV_PRIORITY_ABOVE_NORMAL);
    else if (i < UV_PRIORITY_BELOW_NORMAL)
      ASSERT(priority == UV_PRIORITY_NORMAL);
    else if (i < UV_PRIORITY_LOW)
      ASSERT(priority == UV_PRIORITY_BELOW_NORMAL);
    else
      ASSERT(priority == UV_PRIORITY_LOW);
#endif

    /* Verify that the current PID and 0 are equivalent. */
    ASSERT(uv_os_getpriority(uv_os_getpid(), &r) == 0);
    ASSERT(priority == r);
  }

  /* Verify that invalid priorities return UV_EINVAL. */
  ASSERT(uv_os_setpriority(0, UV_PRIORITY_HIGHEST - 1) == UV_EINVAL);
  ASSERT(uv_os_setpriority(0, UV_PRIORITY_LOW + 1) == UV_EINVAL);

  return 0;
}